

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

bool __thiscall CNetAddr::IsRFC5737(CNetAddr *this)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  CNetAddr *pCVar6;
  long in_FS_OFFSET;
  bool bVar7;
  undefined2 local_11;
  undefined1 local_f;
  undefined2 local_e;
  undefined1 local_c;
  undefined2 local_b;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_net == NET_IPV4) {
    local_b = 0xc0;
    local_9 = 2;
    uVar1 = (this->m_addr)._size;
    uVar4 = uVar1 - 0x11;
    if (uVar1 < 0x11) {
      uVar4 = uVar1;
    }
    if (uVar4 < 3) {
      local_e = 0x33c6;
      local_c = 100;
    }
    else {
      pCVar6 = this;
      if (0x10 < uVar1) {
        pCVar6 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      if ((pCVar6->m_addr)._union.direct[0] == -0x40) {
        lVar5 = 0;
        do {
          if (lVar5 == 2) goto LAB_00d95088;
          lVar2 = lVar5 + 1;
          lVar3 = lVar5 + 1;
          lVar5 = lVar5 + 1;
        } while (*(char *)((long)&local_b + lVar2) == (pCVar6->m_addr)._union.direct[lVar3]);
      }
      local_e = 0x33c6;
      local_c = 100;
      if (uVar4 < 3) {
        local_11 = 0xcb;
        local_f = 0x71;
        goto LAB_00d95071;
      }
      pCVar6 = this;
      if (0x10 < uVar1) {
        pCVar6 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      if ((pCVar6->m_addr)._union.direct[0] == -0x3a) {
        lVar5 = 0;
        do {
          if (lVar5 == 2) goto LAB_00d95088;
          lVar2 = lVar5 + 1;
          lVar3 = lVar5 + 1;
          lVar5 = lVar5 + 1;
        } while (*(char *)((long)&local_e + lVar2) == (pCVar6->m_addr)._union.direct[lVar3]);
      }
    }
    local_c = 100;
    local_e = 0x33c6;
    local_11 = 0xcb;
    local_f = 0x71;
    if (2 < uVar4) {
      if (0x10 < uVar1) {
        this = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
      }
      if ((this->m_addr)._union.direct[0] == -0x35) {
        lVar5 = 0;
        do {
          bVar7 = lVar5 == 2;
          if (bVar7) goto LAB_00d95073;
          lVar2 = lVar5 + 1;
          lVar3 = lVar5 + 1;
          lVar5 = lVar5 + 1;
        } while (*(char *)((long)&local_11 + lVar2) == (this->m_addr)._union.direct[lVar3]);
      }
    }
  }
LAB_00d95071:
  bVar7 = false;
LAB_00d95073:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return bVar7;
LAB_00d95088:
  bVar7 = true;
  goto LAB_00d95073;
}

Assistant:

bool CNetAddr::IsRFC5737() const
{
    return IsIPv4() && (HasPrefix(m_addr, std::array<uint8_t, 3>{192, 0, 2}) ||
                        HasPrefix(m_addr, std::array<uint8_t, 3>{198, 51, 100}) ||
                        HasPrefix(m_addr, std::array<uint8_t, 3>{203, 0, 113}));
}